

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O0

DdNode * Cudd_OverApprox(DdManager *dd,DdNode *f,int numVars,int threshold,int safe,double quality)

{
  DdNode *pDVar1;
  DdNode *g;
  DdNode *subset;
  double quality_local;
  int safe_local;
  int threshold_local;
  int numVars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddUnderApprox(dd,(DdNode *)((ulong)f ^ 1),numVars,threshold,safe,quality);
  } while (dd->reordered == 1);
  return (DdNode *)((ulong)pDVar1 ^ (long)(int)(uint)(pDVar1 != (DdNode *)0x0));
}

Assistant:

DdNode *
Cudd_OverApprox(
  DdManager * dd /* manager */,
  DdNode * f /* function to be superset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* when to stop approximation */,
  int  safe /* enforce safe approximation */,
  double  quality /* minimum improvement for accepted changes */)
{
    DdNode *subset, *g;

    g = Cudd_Not(f);    
    do {
        dd->reordered = 0;
        subset = cuddUnderApprox(dd, g, numVars, threshold, safe, quality);
    } while (dd->reordered == 1);
    
    return(Cudd_NotCond(subset, (subset != NULL)));
    
}